

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_json.cpp
# Opt level: O2

void ritobin::io::json_impl::value_to_json_info(Value *value,json *json)

{
  __index_type _Var1;
  anon_class_8_1_898d99e6 local_10;
  
  _Var1 = (value->
          super__Variant_base<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
          ).
          super__Move_assign_alias<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
          .
          super__Copy_assign_alias<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
          .
          super__Move_ctor_alias<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
          .
          super__Copy_ctor_alias<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
          .
          super__Variant_storage_alias<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
          ._M_index;
  local_10.json = json;
  if (_Var1 == 0xff) {
    std::__throw_bad_variant_access("std::visit: variant is valueless");
    _Var1 = (value->
            super__Variant_base<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
            ).
            super__Move_assign_alias<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
            .
            super__Copy_assign_alias<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
            .
            super__Move_ctor_alias<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
            .
            super__Copy_ctor_alias<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
            .
            super__Variant_storage_alias<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
            ._M_index;
  }
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__deduce_visit_result<void>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/moonshadow565[P]ritobin/ritobin_lib/src/ritobin/bin_io_json.cpp:442:20)_&&,_const_std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_&>
    ::_S_vtable._M_arr[(char)_Var1]._M_data)(&local_10,value);
  return;
}

Assistant:

void value_to_json_info(Value const& value, json& json) noexcept {
        std::visit([&json](auto const& value) noexcept {
            using value_t = std::remove_cvref_t<decltype(value)>;
            json_value_impl<value_t>::to_json_info(value, json);
        }, value);
    }